

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  int iVar1;
  long lVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  stbi__write_context *in_RDI;
  long in_R8;
  uchar header_1;
  uchar header;
  uchar *prev;
  int diff;
  uchar *begin;
  int len;
  uchar *row;
  int jdir;
  int jend;
  int k;
  int j;
  int i;
  int format;
  int colorbytes;
  int has_alpha;
  uchar in_stack_fffffffffffffecf;
  ulong in_stack_fffffffffffffed0;
  stbi__write_context *s_00;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffedc;
  int expand_mono;
  int in_stack_fffffffffffffee4;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 uVar4;
  undefined4 in_stack_fffffffffffffef4;
  uint local_a0;
  void *local_98;
  int local_8c;
  int local_7c;
  int iVar5;
  uint uVar6;
  int local_68;
  uint local_64;
  int local_60;
  int local_2c;
  
  local_a0 = in_ECX;
  if (in_ECX == 2 || in_ECX == 4) {
    local_a0 = in_ECX - 1;
  }
  iVar5 = 2;
  if ((int)local_a0 < 2) {
    iVar5 = 3;
  }
  if (((int)in_EDX < 0) || ((int)in_ESI < 0)) {
    local_2c = 0;
  }
  else if (stbi_write_tga_with_rle == 0) {
    local_2c = stbiw__outfile(in_RDI,-1,-1,(int)(ulong)in_ESI,(int)(ulong)in_EDX,(int)(ulong)in_ECX,
                              0);
  }
  else {
    s_00 = (stbi__write_context *)(in_stack_fffffffffffffed0 & 0xffffffff00000000);
    uVar3 = 0;
    expand_mono = 0;
    uVar4 = CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),in_ESI);
    uVar6 = in_EDX;
    stbiw__writef(in_RDI,"111 221 2222 11",0,0,(ulong)(iVar5 + 8),0,0);
    if (stbi__flip_vertically_on_write == 0) {
      local_64 = uVar6 - 1;
      uVar6 = 0xffffffff;
      iVar5 = -1;
    }
    else {
      local_64 = 0;
      iVar5 = 1;
    }
    for (; local_64 != uVar6; local_64 = iVar5 + local_64) {
      lVar2 = in_R8 + (int)(local_64 * in_ESI * in_ECX);
      for (local_60 = 0; local_60 < (int)in_ESI; local_60 = local_7c + local_60) {
        local_98 = (void *)(lVar2 + (int)(local_60 * in_ECX));
        local_8c = 1;
        local_7c = 1;
        if (local_60 < (int)(in_ESI - 1)) {
          local_7c = 2;
          local_8c = memcmp(local_98,(void *)(lVar2 + (int)((local_60 + 1) * in_ECX)),
                            (long)(int)in_ECX);
          if (local_8c == 0) {
            local_68 = local_60 + 2;
            while ((local_68 < (int)in_ESI && local_7c < 0x80 &&
                   (iVar1 = memcmp(local_98,(void *)(lVar2 + (int)(local_68 * in_ECX)),
                                   (long)(int)in_ECX), iVar1 == 0))) {
              local_7c = local_7c + 1;
              local_68 = local_68 + 1;
            }
          }
          else {
            for (local_68 = local_60 + 2; local_68 < (int)in_ESI && local_7c < 0x80;
                local_68 = local_68 + 1) {
              iVar1 = memcmp(local_98,(void *)(lVar2 + (int)(local_68 * in_ECX)),(long)(int)in_ECX);
              if (iVar1 == 0) {
                local_7c = local_7c + -1;
                break;
              }
              local_98 = (void *)((long)local_98 + (long)(int)in_ECX);
              local_7c = local_7c + 1;
            }
          }
        }
        if (local_8c == 0) {
          stbiw__write1(s_00,in_stack_fffffffffffffecf);
          stbiw__write_pixel((stbi__write_context *)CONCAT44(in_stack_fffffffffffffef4,in_EDX),
                             (int)((ulong)uVar4 >> 0x20),(int)uVar4,in_stack_fffffffffffffee4,
                             expand_mono,(uchar *)CONCAT44(in_stack_fffffffffffffedc,uVar3));
        }
        else {
          stbiw__write1(s_00,in_stack_fffffffffffffecf);
          for (local_68 = 0; local_68 < local_7c; local_68 = local_68 + 1) {
            stbiw__write_pixel((stbi__write_context *)CONCAT44(in_stack_fffffffffffffef4,in_EDX),
                               (int)((ulong)uVar4 >> 0x20),(int)uVar4,in_stack_fffffffffffffee4,
                               expand_mono,(uchar *)CONCAT44(in_stack_fffffffffffffedc,uVar3));
          }
        }
      }
    }
    stbiw__write_flush((stbi__write_context *)0x422b75);
    local_2c = 1;
  }
  return local_2c;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;
      int jend, jdir;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      if (stbi__flip_vertically_on_write) {
         j = 0;
         jend = y;
         jdir = 1;
      } else {
         j = y-1;
         jend = -1;
         jdir = -1;
      }
      for (; j != jend; j += jdir) {
         unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = STBIW_UCHAR(len - 1);
               stbiw__write1(s, header);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = STBIW_UCHAR(len - 129);
               stbiw__write1(s, header);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
      stbiw__write_flush(s);
   }
   return 1;
}